

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain_tests.cpp
# Opt level: O2

void __thiscall blockchain_tests::get_prune_height::test_method(get_prune_height *this)

{
  long lVar1;
  Chainstate *pCVar2;
  optional<int> oVar3;
  CChain *chain;
  iterator pvVar4;
  iterator pvVar5;
  BlockManager *blockman;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = (iterator)0x64;
  pvVar5 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock16,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
             ,100,false);
  pCVar2 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  blockman = &((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman;
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockchain_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  file.m_end = (iterator)0x69;
  file.m_begin = (iterator)&local_48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  chain = &pCVar2->m_chain;
  oVar3 = GetPruneHeight(blockman,chain);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (((ulong)oVar3.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_a0;
  local_a0 = "!GetPruneHeight(blockman, chain).has_value()";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_80 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,0xb5e7d1,(size_t)&stack0xffffffffffffff50,0x69);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  CheckGetPruneHeight(blockman,chain,1);
  CheckGetPruneHeight(blockman,chain,99);
  CheckGetPruneHeight(blockman,chain,100);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock16.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(get_prune_height, TestChain100Setup)
{
    LOCK(::cs_main);
    auto& chain = m_node.chainman->ActiveChain();
    auto& blockman = m_node.chainman->m_blockman;

    // Fresh chain of 100 blocks without any pruned blocks, so std::nullopt should be returned
    BOOST_CHECK(!GetPruneHeight(blockman, chain).has_value());

    // Start pruning
    CheckGetPruneHeight(blockman, chain, 1);
    CheckGetPruneHeight(blockman, chain, 99);
    CheckGetPruneHeight(blockman, chain, 100);
}